

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2023_Test::TestBody
          (ParseVisibilityTest_Edition2023_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParseVisibilityTest_Edition2023_Test *local_10;
  ParseVisibilityTest_Edition2023_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n        edition = \"2023\";\n        export message A {\n          int32 b = 1;\n        }"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,"2:8: Expected top-level statement (e.g. \"message\").\n");
  ParserTest::ExpectHasErrors(&this->super_ParseVisibilityTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2023) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        export message A {
          int32 b = 1;
        })schema",
      "2:8: Expected top-level statement (e.g. \"message\").\n");
}